

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

QAM * __thiscall QAM::notag(QAM *__return_storage_ptr__,QAM *this)

{
  QAM(__return_storage_ptr__,this);
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->tag);
  return __return_storage_ptr__;
}

Assistant:

QAM notag(void) const
    {
        QAM q(*this);
        q.tag = "";
        return q;
    }